

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# armci.c
# Opt level: O0

int PARMCI_AccV(int op,void *scale,armci_giov_t *darr,int len,int proc)

{
  int iVar1;
  comex_giov_t *b;
  int in_ECX;
  armci_giov_t *in_RDX;
  undefined8 in_RSI;
  int in_EDI;
  comex_giov_t *unaff_retaddr;
  comex_giov_t *adarr;
  int rc;
  comex_group_t group;
  int in_stack_fffffffffffffff8;
  
  group = (comex_group_t)((ulong)in_RSI >> 0x20);
  b = (comex_giov_t *)malloc((long)in_ECX * 0x18);
  convert_giov(in_RDX,b,in_ECX);
  iVar1 = comex_accv(rc,adarr,unaff_retaddr,in_EDI,in_stack_fffffffffffffff8,group);
  free(b);
  return iVar1;
}

Assistant:

int PARMCI_AccV(int op, void *scale, armci_giov_t *darr, int len, int proc)
{
    int rc;
    comex_giov_t *adarr = malloc(sizeof(comex_giov_t) * len);
    convert_giov(darr, adarr, len);
    rc = comex_accv(op, scale, adarr, len, proc, COMEX_GROUP_WORLD);
    free(adarr);
    return rc;
}